

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

exr_result_t LossyDctEncoder_execute(LossyDctEncoder *e)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  LossyDctEncoder *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  int i;
  size_t chan_4;
  float *quantTable;
  int vy;
  int vx;
  int x_1;
  int y_1;
  size_t chan_3;
  uint16_t h;
  int blockx;
  int blocky;
  size_t chan_2;
  float src;
  int x;
  float *srcXdr;
  int y;
  uint chan_1;
  uint16_t *tmpHalfBufferPtr;
  uint16_t *tmpHalfBuffer;
  uint chan;
  int tmpHalfBufferElements;
  uint16_t *currAcComp;
  uint16_t halfCoef [64];
  uint16_t halfZigCoef [64];
  int numBlocksY;
  int numBlocksX;
  DctCoderChannelData *chanData [3];
  size_t numComp;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  int iVar6;
  ulong local_1c0;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  float in_stack_fffffffffffffe5c;
  ulong uVar7;
  uint16_t local_192;
  int local_190;
  int local_18c;
  ulong local_188;
  float local_180;
  int local_17c;
  int local_170;
  uint local_16c;
  void *local_168;
  void *local_160;
  uint local_158;
  int local_154;
  uint16_t *local_150;
  uint16_t local_148 [64];
  uint16_t local_c8 [48];
  float *in_stack_ffffffffffffff98;
  float *local_38 [4];
  ulong local_18;
  LossyDctEncoder *local_10;
  exr_result_t local_4;
  
  local_18 = (ulong)in_RDI->_channel_encode_data_count;
  local_10 = in_RDI;
  fVar3 = ceilf((float)in_RDI->_width / 8.0);
  fVar4 = ceilf((float)local_10->_height / 8.0);
  local_150 = (uint16_t *)local_10->_packedAc;
  local_10->_numAcComp = 0;
  local_10->_numDcComp = 0;
  local_154 = 0;
  for (local_158 = 0; local_158 < local_18; local_158 = local_158 + 1) {
    local_38[local_158] = local_10->_channel_encode_data[local_158]->_dctData;
    if (local_38[local_158][0x66] == 2.8026e-45) {
      local_154 = local_10->_width * local_10->_height + local_154;
    }
  }
  local_160 = (void *)0x0;
  if ((local_154 == 0) ||
     (local_160 = internal_exr_alloc(CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)),
     local_160 != (void *)0x0)) {
    local_168 = local_160;
    for (local_16c = 0; local_16c < local_18; local_16c = local_16c + 1) {
      if (local_38[local_16c][0x66] == 2.8026e-45) {
        for (local_170 = 0; local_170 < local_10->_height; local_170 = local_170 + 1) {
          for (local_17c = 0; local_17c < local_10->_width; local_17c = local_17c + 1) {
            local_180 = one_to_native_float(0.0);
            if (local_180 <= 65504.0) {
              if (local_180 < -65504.0) {
                local_180 = -65504.0;
              }
            }
            else {
              local_180 = 65504.0;
            }
            float_to_half(local_180);
            uVar2 = one_from_native16(0);
            *(uint16_t *)((long)local_168 + (long)local_17c * 2) = uVar2;
          }
          *(void **)(*(long *)(local_38[local_16c] + 0x60) + (long)local_170 * 8) = local_168;
          local_168 = (void *)((long)local_168 + (long)local_10->_width * 2);
        }
      }
    }
    *(uint8_t **)(local_38[0] + 0x68) = local_10->_packedDc;
    for (local_188 = 1; local_188 < local_18; local_188 = local_188 + 1) {
      *(long *)(local_38[local_188] + 0x68) =
           *(long *)(local_38[local_188 - 1] + 0x68) + (long)((int)fVar3 * (int)fVar4) * 2;
    }
    for (local_18c = 0; local_18c < (int)fVar4; local_18c = local_18c + 1) {
      for (local_190 = 0; local_190 < (int)fVar3; local_190 = local_190 + 1) {
        for (uVar7 = 0; uVar7 < local_18; uVar7 = uVar7 + 1) {
          for (in_stack_fffffffffffffe5c = 0.0; (int)in_stack_fffffffffffffe5c < 8;
              in_stack_fffffffffffffe5c = (float)((int)in_stack_fffffffffffffe5c + 1)) {
            for (local_1a8 = 0; local_1a8 < 8; local_1a8 = local_1a8 + 1) {
              local_1ac = local_190 * 8 + local_1a8;
              local_1b0 = local_18c * 8 + (int)in_stack_fffffffffffffe5c;
              if (local_10->_width <= local_1ac) {
                local_1ac = local_10->_width - (local_1ac - (local_10->_width + -1));
              }
              if (local_1ac < 0) {
                local_1ac = local_10->_width + -1;
              }
              if (local_10->_height <= local_1b0) {
                local_1b0 = local_10->_height - (local_1b0 - (local_10->_height + -1));
              }
              if (local_1b0 < 0) {
                local_1b0 = local_10->_height + -1;
              }
              if (local_10->_toNonlinear == (uint16_t *)0x0) {
                local_192 = one_to_native16(0);
              }
              else {
                local_192 = local_10->_toNonlinear
                            [*(ushort *)
                              (*(long *)(*(long *)(local_38[uVar7] + 0x60) + (long)local_1b0 * 8) +
                              (long)local_1ac * 2)];
              }
              fVar5 = half_to_float(local_192);
              local_38[uVar7][(int)in_stack_fffffffffffffe5c * 8 + local_1a8] = fVar5;
            }
          }
        }
        if (local_18 == 3) {
          csc709Forward64(local_38[0],local_38[1],local_38[2]);
        }
        for (local_1c0 = 0; local_1c0 < local_18; local_1c0 = local_1c0 + 1) {
          dctForward8x8(in_stack_ffffffffffffff98);
          for (iVar6 = 0; iVar6 < 0x40; iVar6 = iVar6 + 1) {
            uVar2 = quantize((float)uVar7,in_stack_fffffffffffffe5c);
            local_c8[(long)iVar6 + -0x40] = uVar2;
          }
          toZigZag(local_c8,local_148);
          priv_from_native16(local_c8,0x40);
          puVar1 = *(uint16_t **)(local_38[local_1c0] + 0x68);
          *(uint16_t **)(local_38[local_1c0] + 0x68) = puVar1 + 1;
          *puVar1 = local_c8[0];
          local_10->_numDcComp = local_10->_numDcComp + 1;
          LossyDctEncoder_rleAc(local_10,local_c8,&local_150);
        }
      }
    }
    if (local_160 != (void *)0x0) {
      internal_exr_free((void *)0x11e974);
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

exr_result_t
LossyDctEncoder_execute (LossyDctEncoder* e)
{
    size_t               numComp = e->_channel_encode_data_count;
    DctCoderChannelData* chanData[3];

    int numBlocksX = (int) ceilf ((float) e->_width / 8.0f);
    int numBlocksY = (int) ceilf ((float) e->_height / 8.0f);

    uint16_t halfZigCoef[64];
    uint16_t halfCoef[64];

    uint16_t* currAcComp = (uint16_t*) e->_packedAc;

    e->_numAcComp = 0;
    e->_numDcComp = 0;

    //
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //
    int tmpHalfBufferElements = 0;

    for (unsigned int chan = 0; chan < numComp; ++chan)
    {
        chanData[chan] = e->_channel_encode_data[chan];
        if (chanData[chan]->_type == EXR_PIXEL_FLOAT)
            tmpHalfBufferElements += e->_width * e->_height;
    }

    uint16_t* tmpHalfBuffer    = NULL;
    uint16_t* tmpHalfBufferPtr = NULL;
    if (tmpHalfBufferElements)
    {
        tmpHalfBuffer = (uint16_t*) internal_exr_alloc (
            tmpHalfBufferElements * sizeof (uint16_t));
        if (!tmpHalfBuffer) return EXR_ERR_OUT_OF_MEMORY;
        tmpHalfBufferPtr = tmpHalfBuffer;
    }

    //
    // Run over all the float scanlines, quantizing,
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (unsigned int chan = 0; chan < numComp; ++chan)
    {
        if (chanData[chan]->_type != EXR_PIXEL_FLOAT) continue;

        for (int y = 0; y < e->_height; ++y)
        {
            const float* srcXdr = (const float*) chanData[chan]->_rows[y];

            for (int x = 0; x < e->_width; ++x)
            {
                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                float src = one_to_native_float (srcXdr[x]);
                if (src > 65504.f)
                    src = 65504.f;
                else if (src < -65504.f)
                    src = -65504.f;
                tmpHalfBufferPtr[x] = one_from_native16 (float_to_half (src));
            }

            chanData[chan]->_rows[y] = (uint8_t*) tmpHalfBufferPtr;
            tmpHalfBufferPtr += e->_width;
        }
    }

    //
    // Pack DC components together by common plane, so we can get
    // a little more out of differencing them. We'll always have
    // one component per block, so we can computed offsets.
    //

    chanData[0]->_dc_comp = (uint16_t*) e->_packedDc;
    for (size_t chan = 1; chan < numComp; ++chan)
        chanData[chan]->_dc_comp =
            chanData[chan - 1]->_dc_comp + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            uint16_t h;

            for (size_t chan = 0; chan < numComp; ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= e->_width)
                            vx = e->_width - (vx - (e->_width - 1));

                        if (vx < 0) vx = e->_width - 1;

                        if (vy >= e->_height)
                            vy = e->_height - (vy - (e->_height - 1));

                        if (vy < 0) vy = e->_height - 1;

                        h = ((const uint16_t*) (chanData[chan]->_rows)[vy])[vx];

                        if (e->_toNonlinear) { h = e->_toNonlinear[h]; }
                        else { h = one_to_native16 (h); }

                        chanData[chan]->_dctData[y * 8 + x] = half_to_float (h);
                    } // x
                }     // y
            }         // chan

            //
            // Color space conversion
            //

            if (numComp == 3)
            {
                csc709Forward64 (
                    chanData[0]->_dctData,
                    chanData[1]->_dctData,
                    chanData[2]->_dctData);
            }

            const float* quantTable = e->_quantTableY;
            for (size_t chan = 0; chan < numComp; ++chan)
            {
                //
                // Forward DCT
                //
                dctForward8x8 (chanData[chan]->_dctData);

                //
                // Quantize to half, and zigzag
                //

                for (int i = 0; i < 64; ++i)
                {
                    halfCoef[i] = quantize (
                        chanData[chan]->_dctData[i],
                        quantTable[i]);
                }

                toZigZag (halfZigCoef, halfCoef);

                //
                // Convert from NATIVE back to XDR, before we write out
                //
                priv_from_native16 (halfZigCoef, 64);

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *(chanData[chan]->_dc_comp)++ = halfZigCoef[0];
                e->_numDcComp++;

                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                LossyDctEncoder_rleAc (e, halfZigCoef, &currAcComp);
                quantTable = e->_quantTableCbCr;
            } // chan
        }     // blockx
    }         // blocky

    if (tmpHalfBuffer) internal_exr_free (tmpHalfBuffer);

    return EXR_ERR_SUCCESS;
}